

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_utilization_query_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0x16;
  iVar2 = 0x16;
  if ((((oldlenp != (size_t *)0x0 && oldp != (void *)0x0) && (iVar2 = iVar1, newlen == 8)) &&
      (newp != (void *)0x0)) && (*oldlenp == 0x30)) {
    duckdb_je_inspect_extent_util_stats_verbose_get
              ((tsdn_t *)tsd,*newp,(size_t *)((long)oldp + 8),(size_t *)((long)oldp + 0x10),
               (size_t *)((long)oldp + 0x18),(size_t *)((long)oldp + 0x20),
               (size_t *)((long)oldp + 0x28),(void **)oldp);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
experimental_utilization_query_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	assert(sizeof(inspect_extent_util_stats_verbose_t)
	    == sizeof(void *) + sizeof(size_t) * 5);

	if (oldp == NULL || oldlenp == NULL
	    || *oldlenp != sizeof(inspect_extent_util_stats_verbose_t)
	    || newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}

	void *ptr = NULL;
	WRITE(ptr, void *);
	inspect_extent_util_stats_verbose_t *util_stats
	    = (inspect_extent_util_stats_verbose_t *)oldp;
	inspect_extent_util_stats_verbose_get(tsd_tsdn(tsd), ptr,
	    &util_stats->nfree, &util_stats->nregs, &util_stats->size,
	    &util_stats->bin_nfree, &util_stats->bin_nregs,
	    &util_stats->slabcur_addr);
	ret = 0;

label_return:
	return ret;
}